

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O3

int proxy_h2_process_pending_input(Curl_cfilter *cf,Curl_easy *data,CURLcode *err)

{
  bufq *q;
  undefined8 *puVar1;
  _Bool _Var2;
  size_t sVar3;
  char *pcVar4;
  size_t blen;
  uchar *buf;
  size_t local_48;
  uint8_t *local_40;
  CURLcode *local_38;
  
  puVar1 = (undefined8 *)cf->ctx;
  q = (bufq *)(puVar1 + 2);
  _Var2 = Curl_bufq_peek(q,&local_40,&local_48);
  local_38 = err;
  if (_Var2) {
    do {
      sVar3 = nghttp2_session_mem_recv((nghttp2_session *)*puVar1,local_40,local_48);
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"[0] %zu bytes to nghttp2 -> %zd",local_48,sVar3);
      }
      if ((long)sVar3 < 0) {
        pcVar4 = nghttp2_strerror((int)sVar3);
        Curl_failf(data,"process_pending_input: nghttp2_session_mem_recv() returned %zd:%s",sVar3,
                   pcVar4);
        *local_38 = CURLE_RECV_ERROR;
        return -1;
      }
      Curl_bufq_skip(q,sVar3);
      _Var2 = Curl_bufq_is_empty(q);
      if (_Var2) {
        if (data == (Curl_easy *)0x0) {
          return 0;
        }
        if (((data->set).field_0x8bd & 0x10) == 0) {
          return 0;
        }
        if (cf->cft->log_level < 1) {
          return 0;
        }
        Curl_trc_cf_infof(data,cf,"[0] all data in connection buffer processed");
        return 0;
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        sVar3 = Curl_bufq_len(q);
        Curl_trc_cf_infof(data,cf,"[0] process_pending_input: %zu bytes left in connection buffer",
                          sVar3);
      }
      _Var2 = Curl_bufq_peek(q,&local_40,&local_48);
    } while (_Var2);
  }
  return 0;
}

Assistant:

static int proxy_h2_process_pending_input(struct Curl_cfilter *cf,
                                          struct Curl_easy *data,
                                          CURLcode *err)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  const unsigned char *buf;
  size_t blen;
  ssize_t rv;

  while(Curl_bufq_peek(&ctx->inbufq, &buf, &blen)) {

    rv = nghttp2_session_mem_recv(ctx->h2, (const uint8_t *)buf, blen);
    CURL_TRC_CF(data, cf, "[0] %zu bytes to nghttp2 -> %zd", blen, rv);
    if(rv < 0) {
      failf(data,
            "process_pending_input: nghttp2_session_mem_recv() returned "
            "%zd:%s", rv, nghttp2_strerror((int)rv));
      *err = CURLE_RECV_ERROR;
      return -1;
    }
    Curl_bufq_skip(&ctx->inbufq, (size_t)rv);
    if(Curl_bufq_is_empty(&ctx->inbufq)) {
      CURL_TRC_CF(data, cf, "[0] all data in connection buffer processed");
      break;
    }
    else {
      CURL_TRC_CF(data, cf, "[0] process_pending_input: %zu bytes left "
                  "in connection buffer", Curl_bufq_len(&ctx->inbufq));
    }
  }

  return 0;
}